

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O1

void __thiscall
ON_SubDLevelComponentIdIterator::Initialize
          (ON_SubDLevelComponentIdIterator *this,bool bLevelLinkedListIncreasingId,Type ctype,
          ON_SubDimple *subdimple,ON_SubDLevel *level)

{
  int iVar1;
  undefined7 in_register_00000011;
  ON_SubDVertex *pOVar2;
  
  this->m_bLevelLinkedListIncreasingId = false;
  this->m_ctype = ctype;
  this->m_level_index = (unsigned_short)level->m_level_index;
  this->m_first = (ON_SubDComponentBaseLink *)0x0;
  this->m_current = (ON_SubDComponentBaseLink *)0x0;
  this->m_count = 0;
  this->m_prev_id = 0;
  iVar1 = (int)CONCAT71(in_register_00000011,ctype);
  if (iVar1 == 6) {
    pOVar2 = (ON_SubDVertex *)level->m_face[0];
  }
  else if (iVar1 == 4) {
    pOVar2 = (ON_SubDVertex *)level->m_edge[0];
  }
  else if (iVar1 == 2) {
    pOVar2 = level->m_vertex[0];
  }
  else {
    pOVar2 = (ON_SubDVertex *)0x0;
  }
  this->m_first = (ON_SubDComponentBaseLink *)pOVar2;
  if ((pOVar2 != (ON_SubDVertex *)0x0) &&
     (this->m_bLevelLinkedListIncreasingId = bLevelLinkedListIncreasingId,
     !bLevelLinkedListIncreasingId)) {
    ON_SubDimple::InitializeComponentIdIterator(subdimple,ctype,&this->m_cidit);
    return;
  }
  return;
}

Assistant:

void ON_SubDLevelComponentIdIterator::Initialize(
  bool bLevelLinkedListIncreasingId,
  ON_SubDComponentPtr::Type ctype,
  const ON_SubDimple& subdimple,
  const ON_SubDLevel& level
)
{
  m_bLevelLinkedListIncreasingId = false;
  m_ctype = ctype;
  m_level_index = (unsigned short)level.m_level_index;
  m_count = 0;
  m_prev_id = 0;
  m_first = nullptr;
  m_current = nullptr;

  switch (ctype)
  {
  case ON_SubDComponentPtr::Type::Vertex:
      m_first = (const ON_SubDComponentBaseLink*)level.m_vertex[0];
      break;
  case ON_SubDComponentPtr::Type::Edge:
      m_first = (const ON_SubDComponentBaseLink*)level.m_edge[0];
      break;
  case ON_SubDComponentPtr::Type::Face:
      m_first = (const ON_SubDComponentBaseLink*)level.m_face[0];
      break;
  default:
    m_first = nullptr;
    break;
  }

  if (nullptr == m_first)
    return;

  m_bLevelLinkedListIncreasingId = bLevelLinkedListIncreasingId;

  if (false == m_bLevelLinkedListIncreasingId)
  {
    subdimple.InitializeComponentIdIterator(ctype, m_cidit);
  }
}